

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O0

void test_inflate(Byte *compr,uLong comprLen,Byte *uncompr,uLong uncomprLen)

{
  int iVar1;
  Byte *local_a0;
  z_stream d_stream;
  int err;
  uLong uncomprLen_local;
  Byte *uncompr_local;
  uLong comprLen_local;
  Byte *compr_local;
  
  strcpy((char *)uncompr,"garbage");
  d_stream.state = (internal_state *)zalloc;
  d_stream.zalloc = (alloc_func)zfree;
  d_stream.zfree = (free_func)0x0;
  d_stream.next_in._0_4_ = 0;
  local_a0 = compr;
  d_stream.total_in = (uLong)uncompr;
  d_stream.reserved._4_4_ = inflateInit_(&local_a0,"1.2.11",0x70);
  if (d_stream.reserved._4_4_ != 0) {
    fprintf(_stderr,"%s error: %d\n","inflateInit",(ulong)d_stream.reserved._4_4_);
    exit(1);
  }
  d_stream.reserved._4_4_ = 0;
  while ((ulong)d_stream._32_8_ < uncomprLen && (ulong)d_stream._8_8_ < comprLen) {
    d_stream.next_out._0_4_ = 1;
    d_stream.next_in._0_4_ = 1;
    d_stream.reserved._4_4_ = inflate(&local_a0,0);
    if (d_stream.reserved._4_4_ == 1) break;
    if (d_stream.reserved._4_4_ != 0) {
      fprintf(_stderr,"%s error: %d\n","inflate",(ulong)d_stream.reserved._4_4_);
      exit(1);
    }
  }
  d_stream.reserved._4_4_ = inflateEnd(&local_a0);
  if (d_stream.reserved._4_4_ != 0) {
    fprintf(_stderr,"%s error: %d\n","inflateEnd",(ulong)d_stream.reserved._4_4_);
    exit(1);
  }
  iVar1 = strcmp((char *)uncompr,hello);
  if (iVar1 != 0) {
    fprintf(_stderr,"bad inflate\n");
    exit(1);
  }
  printf("inflate(): %s\n",uncompr);
  return;
}

Assistant:

void test_inflate(compr, comprLen, uncompr, uncomprLen)
    Byte *compr, *uncompr;
    uLong comprLen, uncomprLen;
{
    int err;
    z_stream d_stream; /* decompression stream */

    strcpy((char*)uncompr, "garbage");

    d_stream.zalloc = zalloc;
    d_stream.zfree = zfree;
    d_stream.opaque = (voidpf)0;

    d_stream.next_in  = compr;
    d_stream.avail_in = 0;
    d_stream.next_out = uncompr;

    err = inflateInit(&d_stream);
    CHECK_ERR(err, "inflateInit");

    while (d_stream.total_out < uncomprLen && d_stream.total_in < comprLen) {
        d_stream.avail_in = d_stream.avail_out = 1; /* force small buffers */
        err = inflate(&d_stream, Z_NO_FLUSH);
        if (err == Z_STREAM_END) break;
        CHECK_ERR(err, "inflate");
    }

    err = inflateEnd(&d_stream);
    CHECK_ERR(err, "inflateEnd");

    if (strcmp((char*)uncompr, hello)) {
        fprintf(stderr, "bad inflate\n");
        exit(1);
    } else {
        printf("inflate(): %s\n", (char *)uncompr);
    }
}